

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O3

int mg_secure_transport_init
              (int sockfd,char *cert_file,char *key_file,mg_secure_transport **transport,
              mg_allocator *allocator)

{
  mg_allocator *allocator_00;
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  SSL *s;
  BIO *rbio;
  X509 *x;
  EVP_PKEY *pkey;
  EVP_MD *type;
  char *pcVar2;
  byte *md;
  ulong uVar3;
  uint peer_pubkey_fp_len;
  uchar peer_pubkey_fp [64];
  uint local_9c;
  char *local_98;
  mg_allocator *local_90;
  mg_secure_transport *local_88;
  mg_secure_transport **local_80;
  byte local_78 [72];
  
  ERR_clear_error();
  meth = (SSL_METHOD *)TLS_client_method();
  ctx = SSL_CTX_new(meth);
  if (ctx == (SSL_CTX *)0x0) {
    rbio = (BIO *)0x0;
    s = (SSL *)0x0;
LAB_00108c66:
    ctx = (SSL_CTX *)0x0;
  }
  else {
    if ((key_file == (char *)0x0 || cert_file == (char *)0x0) ||
       ((iVar1 = SSL_CTX_use_certificate_chain_file(ctx,cert_file), iVar1 == 1 &&
        (iVar1 = SSL_CTX_use_PrivateKey_file(ctx,key_file,1), iVar1 == 1)))) {
      SSL_CTX_set_options(ctx);
      s = SSL_new(ctx);
      if (s != (SSL *)0x0) {
        SSL_CTX_free(ctx);
        ctx = (SSL_CTX *)0x0;
        rbio = BIO_new_socket(sockfd,0);
        if (rbio != (BIO *)0x0) {
          SSL_set_bio(s,rbio,rbio);
          iVar1 = SSL_connect(s);
          if (-1 < iVar1) {
            local_90 = allocator;
            x = (X509 *)SSL_get1_peer_certificate(s);
            pkey = X509_get_pubkey(x);
            iVar1 = EVP_PKEY_get_base_id(pkey);
            EVP_PKEY_free(pkey);
            if (iVar1 == 0) {
              local_98 = "UNKNOWN";
            }
            else {
              local_98 = OBJ_nid2ln(iVar1);
            }
            type = EVP_sha512();
            md = local_78;
            iVar1 = X509_pubkey_digest(x,type,md,&local_9c);
            X509_free(x);
            allocator_00 = local_90;
            if (iVar1 == 1) {
              local_88 = (mg_secure_transport *)mg_allocator_malloc(local_90,0x50);
              if (local_88 != (mg_secure_transport *)0x0) {
                local_80 = transport;
                BIO_ctrl(rbio,9,1,(void *)0x0);
                local_88->ssl = (SSL *)s;
                local_88->bio = (BIO *)rbio;
                local_88->peer_pubkey_type = local_98;
                pcVar2 = (char *)mg_allocator_malloc(allocator_00,(ulong)(local_9c * 2 + 1));
                if ((ulong)local_9c != 0) {
                  uVar3 = 0;
                  do {
                    sprintf(pcVar2 + (uVar3 & 0xffffffff),"%02x",(ulong)*md);
                    uVar3 = uVar3 + 2;
                    md = md + 1;
                  } while ((ulong)local_9c * 2 != uVar3);
                }
                local_88->peer_pubkey_fp = pcVar2;
                local_88->send = mg_secure_transport_send;
                local_88->recv = mg_secure_transport_recv;
                local_88->suspend_until_ready_to_read = (_func_void_mg_transport_ptr *)0x0;
                local_88->suspend_until_ready_to_write = (_func_void_mg_transport_ptr *)0x0;
                local_88->destroy = mg_secure_transport_destroy;
                local_88->allocator = local_90;
                *local_80 = local_88;
                return 0;
              }
              SSL_CTX_free((SSL_CTX *)0x0);
              iVar1 = -3;
              goto LAB_00108c8f;
            }
          }
          goto LAB_00108c66;
        }
        rbio = (BIO *)0x0;
        goto LAB_00108c69;
      }
    }
    rbio = (BIO *)0x0;
    s = (SSL *)0x0;
  }
LAB_00108c69:
  ERR_print_errors_cb(print_ssl_error,"mg_secure_transport_init");
  SSL_CTX_free(ctx);
  iVar1 = -0x11;
  if (s == (SSL *)0x0) {
    BIO_free(rbio);
    return -0x11;
  }
LAB_00108c8f:
  SSL_free(s);
  return iVar1;
}

Assistant:

int mg_secure_transport_init(int sockfd, const char *cert_file,
                             const char *key_file,
                             mg_secure_transport **transport,
                             mg_allocator *allocator) {
  mg_openssl_init();

  SSL_CTX *ctx = NULL;
  SSL *ssl = NULL;
  BIO *bio = NULL;

  int status = 0;

  ERR_clear_error();

#if OPENSSL_VERSION_NUMBER < 0x10100000L
  ctx = SSL_CTX_new(SSLv23_client_method());
#else
  ctx = SSL_CTX_new(TLS_client_method());
#endif

  if (!ctx) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  if (cert_file && key_file) {
    if (SSL_CTX_use_certificate_chain_file(ctx, cert_file) != 1 ||
        SSL_CTX_use_PrivateKey_file(ctx, key_file, SSL_FILETYPE_PEM) != 1) {
      status = MG_ERROR_SSL_ERROR;
      goto failure;
    }
  }

  SSL_CTX_set_options(ctx, SSL_OP_NO_SSLv3);
  ssl = SSL_new(ctx);

  if (!ssl) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  // SSL_CTX object is reference counted, we're destroying this local reference,
  // but reference from SSL object stays.
  SSL_CTX_free(ctx);
  ctx = NULL;

  bio = BIO_new_socket(sockfd, BIO_NOCLOSE);
  if (!bio) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }
  SSL_set_bio(ssl, bio, bio);

  int ret = SSL_connect(ssl);
  if (ret < 0) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  // Get server's public key type and fingerprint.
  X509 *peer_cert = SSL_get_peer_certificate(ssl);
  assert(peer_cert);
  EVP_PKEY *peer_pubkey = X509_get_pubkey(peer_cert);
  int nid = EVP_PKEY_base_id(peer_pubkey);
  EVP_PKEY_free(peer_pubkey);
  const char *peer_pubkey_type =
      (nid == NID_undef) ? "UNKNOWN" : OBJ_nid2ln(nid);
  unsigned char peer_pubkey_fp[EVP_MAX_MD_SIZE];
  unsigned int peer_pubkey_fp_len;
  if (X509_pubkey_digest(peer_cert, EVP_sha512(), peer_pubkey_fp,
                         &peer_pubkey_fp_len) != 1) {
    status = MG_ERROR_SSL_ERROR;
    X509_free(peer_cert);
    goto failure;
  }
  X509_free(peer_cert);

  mg_secure_transport *ttransport =
      mg_allocator_malloc(allocator, sizeof(mg_secure_transport));
  if (!ttransport) {
    status = MG_ERROR_OOM;
    goto failure;
  }

  // Take ownership of the socket now that everything went well.
  BIO_set_close(bio, BIO_CLOSE);

  ttransport->ssl = ssl;
  ttransport->bio = bio;
  ttransport->peer_pubkey_type = peer_pubkey_type;
  ttransport->peer_pubkey_fp =
      hex_encode(peer_pubkey_fp, peer_pubkey_fp_len, allocator);
  ttransport->send = mg_secure_transport_send;
  ttransport->recv = mg_secure_transport_recv;
  ttransport->suspend_until_ready_to_read = NULL;
  ttransport->suspend_until_ready_to_write = NULL;
  ttransport->destroy = mg_secure_transport_destroy;
  ttransport->allocator = allocator;
  *transport = ttransport;

  return 0;

failure:
  if (status == MG_ERROR_SSL_ERROR) {
    ERR_print_errors_cb(print_ssl_error, "mg_secure_transport_init");
  }
  SSL_CTX_free(ctx);
  if (ssl) {
    // If SSL object was successfuly created, it owns the BIO so we don't need
    // to destroy it.
    SSL_free(ssl);
  } else {
    BIO_free(bio);
  }

  return status;
}